

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

int __thiscall NULLCIO::ReadTextFromConsole(NULLCIO *this,NULLCArray data)

{
  size_t sVar1;
  uint uVar2;
  uint local_848;
  uint local_844;
  uint local_83c;
  uint i;
  char *target;
  NULLCIO local_828 [4];
  uint len;
  char buf [2048];
  NULLCArray data_local;
  
  uVar2 = (uint)data.ptr;
  buf._2040_8_ = this;
  if (this == (NULLCIO *)0x0) {
    nullcThrowError("ERROR: argument should not be a nullptr",data.ptr,data.len);
    data_local.ptr._4_4_ = 0;
  }
  else if (readFunc == 0) {
    data_local.ptr._4_4_ = 0;
  }
  else {
    ReadString((char *)local_828,0x800);
    if (uVar2 == 0) {
      data_local.ptr._4_4_ = 0;
    }
    else {
      sVar1 = strlen((char *)local_828);
      local_848 = (int)sVar1 + 1;
      local_83c = 0;
      while( true ) {
        local_844 = local_848;
        if (uVar2 < local_848) {
          local_844 = uVar2;
        }
        if (local_844 <= local_83c) break;
        this[local_83c] = local_828[local_83c];
        local_83c = local_83c + 1;
      }
      this[uVar2 - 1] = (NULLCIO)0x0;
      if (uVar2 - 1 <= local_848) {
        local_848 = uVar2 - 1;
      }
      data_local.ptr._4_4_ = local_848;
    }
  }
  return data_local.ptr._4_4_;
}

Assistant:

int ReadTextFromConsole(NULLCArray data)
	{
		if(!data.ptr)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return 0;
		}

		if(!readFunc)
			return 0;

		char buf[2048];
		ReadString(buf, 2048);

		if(!data.len)
			return 0;

		unsigned int len = (unsigned int)strlen(buf) + 1;
		char *target = data.ptr;
		for(unsigned int i = 0; i < (data.len < len ? data.len : len); i++)
			target[i] = buf[i];
		target[data.len - 1] = 0;
		
		return ((unsigned int)len < data.len - 1 ? len : data.len - 1);
	}